

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O2

bool empty_port::impl<(empty_port::Kind)0>::check_port_impl(port_t port,char *host)

{
  int iVar1;
  SocketHolder sh;
  sockaddr_in remote_addr;
  
  iVar1 = socket(2,1,0);
  SocketHolder::SocketHolder(&sh,iVar1);
  fill_struct(&sh.socket_,&remote_addr,port,host);
  iVar1 = connect(sh.socket_,(sockaddr *)&remote_addr,0x10);
  SocketHolder::~SocketHolder(&sh);
  return iVar1 != 0;
}

Assistant:

inline bool impl<TCP>::check_port_impl(const port_t port, const char *host) {
    SocketHolder sh(socket(AF_INET, SOCK_STREAM, 0));
    sockaddr_in remote_addr;

    fill_struct(sh.socket(), remote_addr, port, host);

    if ((connect(sh.socket(), (struct sockaddr *)&remote_addr,
                 sizeof(remote_addr)))) {
        return true;
    } else {
        return false;
    }
}